

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

cmFortranSourceInfo * __thiscall
cmDependsFortranInternals::CreateObjectInfo(cmDependsFortranInternals *this,string *obj,string *src)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_bool>
  pVar2;
  value_type entry;
  cmFortranSourceInfo local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  local_128;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
          ::find(&(this->ObjectInfo)._M_t,obj);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->ObjectInfo)._M_t._M_impl.super__Rb_tree_header) {
    __s = &local_208.Source.field_2;
    memset(__s,0,0xb0);
    local_208.Source._M_string_length = 0;
    local_208.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_208.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
    local_208.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_208.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_208.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
    local_208.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_208.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_208.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header;
    local_208.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header;
    local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_208.Source._M_dataplus._M_p = (pointer)__s;
    local_208.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_208.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_208.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_208.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_208.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_208.Intrinsics._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_208.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::pair<cmFortranSourceInfo,_true>(&local_128,obj,&local_208);
    cmFortranSourceInfo::~cmFortranSourceInfo(&local_208);
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmFortranSourceInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmFortranSourceInfo>>>
                        *)&this->ObjectInfo,&local_128);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
    std::__cxx11::string::_M_assign((string *)(iVar1._M_node + 2));
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
    ::~pair(&local_128);
  }
  return (cmFortranSourceInfo *)(iVar1._M_node + 2);
}

Assistant:

cmFortranSourceInfo& CreateObjectInfo(const std::string& obj,
                                        const std::string& src)
  {
    auto i = this->ObjectInfo.find(obj);
    if (i == this->ObjectInfo.end()) {
      std::map<std::string, cmFortranSourceInfo>::value_type entry(
        obj, cmFortranSourceInfo());
      i = this->ObjectInfo.insert(entry).first;
      i->second.Source = src;
    }
    return i->second;
  }